

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::gen_queries(NegativeTestContext *ctx)

{
  GLuint ids;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"GL_INVALID_VALUE is generated if n is negative.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffff00000000;
  glu::CallLogWrapper::glGenQueries(&ctx->super_CallLogWrapper,-1,(GLuint *)&local_38);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void gen_queries (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if n is negative.");
	GLuint ids = 0;
	ctx.glGenQueries	(-1, &ids);
	ctx.expectError		(GL_INVALID_VALUE);
	ctx.endSection();
}